

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O0

Function * __thiscall stackjit::Loader::Function::className_abi_cxx11_(Function *this)

{
  long in_RSI;
  Function *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x60));
  return this;
}

Assistant:

std::string Loader::Function::className() const {
		return mClassName;
	}